

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_barrier.cpp
# Opt level: O0

int __kmp_barrier_template<false>
              (barrier_type bt,int gtid,int is_split,size_t reduce_size,void *reduce_data,
              _func_void_void_ptr_void_ptr *reduce)

{
  kmp_bar_pat_e kVar1;
  kmp_info_t **ppkVar2;
  int iVar3;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  barrier_type in_EDI;
  kmp_info_t *in_R8;
  long in_R9;
  void *unaff_retaddr;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  kmp_info_t *in_stack_00000018;
  int in_stack_00000020;
  barrier_type in_stack_00000024;
  void *itt_sync_obj_1;
  kmp_uint64 delta;
  int i;
  int nproc;
  kmp_info_t **other_threads;
  kmp_uint64 cur_time;
  ident_t *loc;
  kmp_int32 cancel_request;
  void *itt_sync_obj;
  ompt_sync_region_t barrier_kind;
  void *return_address;
  ompt_data_t *my_parallel_data;
  ompt_data_t *my_task_data;
  is_cancellable<false> cancelled;
  int status;
  kmp_team_t *team;
  kmp_info_t *this_thr;
  int tid;
  memory_order __b;
  memory_order __b_1;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  kmp_team_t *in_stack_ffffffffffffff00;
  __itt_timestamp reduction;
  barrier_type bt_00;
  kmp_info_t *in_stack_ffffffffffffff08;
  atomic<int> *paVar4;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  kmp_team_t *in_stack_ffffffffffffff18;
  atomic<int> *paVar5;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff2c;
  int iVar6;
  kmp_info_t *in_stack_ffffffffffffff30;
  kmp_team_t *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int iVar7;
  int in_stack_ffffffffffffff44;
  kmp_uint64 kVar8;
  ident_t *imbalance;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  void *begin;
  ompt_sync_region_t in_stack_ffffffffffffff74;
  void *local_88;
  ompt_data_t *in_stack_ffffffffffffff80;
  int iVar9;
  ompt_data_t *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  undefined4 uVar10;
  int iVar11;
  kmp_team_p *team_00;
  kmp_info_t *thr;
  undefined4 in_stack_ffffffffffffffa8;
  barrier_type bVar12;
  memory_order in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  __int_type in_stack_fffffffffffffff4;
  undefined8 in_stack_fffffffffffffff8;
  
  iVar9 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  bVar12 = (barrier_type)((ulong)in_RCX >> 0x20);
  iVar3 = __kmp_tid_from_gtid(in_ESI);
  thr = __kmp_threads[in_ESI];
  team_00 = (thr->th).th_team;
  uVar10 = 0;
  if (((ulong)ompt_enabled & 1) != 0) {
    in_stack_ffffffffffffff88 = &(((thr->th).th_current_task)->ompt_task_info).task_data;
    in_stack_ffffffffffffff80 = &(((thr->th).th_team)->t).ompt_team_info.parallel_data;
    local_88 = *(void **)(thr->th_pad + 0x158);
    in_stack_ffffffffffffff74 = __ompt_get_barrier_kind(in_EDI,thr);
    if (((ulong)ompt_enabled >> 0x17 & 1) != 0) {
      (*ompt_callbacks.ompt_callback_sync_region_callback)
                (in_stack_ffffffffffffff74,ompt_scope_begin,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff88,local_88);
    }
    if (((ulong)ompt_enabled >> 0x10 & 1) != 0) {
      (*ompt_callbacks.ompt_callback_sync_region_wait_callback)
                (in_stack_ffffffffffffff74,ompt_scope_begin,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff88,local_88);
    }
    *(char *)((long)thr + 0x160) = '\x10';
    *(char *)((long)thr + 0x161) = '\0';
    *(char *)((long)thr + 0x162) = '\0';
    *(char *)((long)thr + 0x163) = '\0';
  }
  iVar6 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if ((team_00->t).t_serialized == 0) {
    begin = (void *)0x0;
    if (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0) {
      begin = __kmp_itt_barrier_object
                        (in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,iVar6,
                         (int)in_stack_ffffffffffffff38);
    }
    if (__kmp_tasking_mode == tskm_extra_barrier) {
      __kmp_tasking_barrier
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    }
    if (__kmp_dflt_blocktime != 0x7fffffff) {
      iVar6 = __kmp_dflt_blocktime;
      if (((((team_00->t).t_threads[iVar3]->th).th_current_task)->td_icvs).bt_set != '\0') {
        iVar6 = ((((team_00->t).t_threads[iVar3]->th).th_current_task)->td_icvs).blocktime;
      }
      (thr->th).th_team_bt_intervals = (long)iVar6 * __kmp_ticks_per_msec;
    }
    if (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0) {
      __kmp_itt_barrier_starting
                (in_stack_fffffffffffffef4,
                 (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    if (in_R9 != 0) {
      *(kmp_info_t **)(thr->th_pad + 0x118) = in_R8;
    }
    if ((iVar3 == 0) && (__kmp_tasking_mode != tskm_immediate_exec)) {
      __kmp_task_team_setup
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    }
    bt_00 = (barrier_type)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    iVar6 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    kVar1 = __kmp_barrier_gather_pattern[in_EDI];
    iVar11 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if (kVar1 == bp_tree_bar) {
      if (__kmp_barrier_gather_branch_bits[in_EDI] == 0) {
        __kmp_debug_assert((char *)CONCAT44(uVar10,in_stack_ffffffffffffff90),
                           (char *)&in_stack_ffffffffffffff88->value,iVar11);
      }
      __kmp_tree_barrier_gather
                (bVar12,in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                 (_func_void_void_ptr_void_ptr *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),thr);
      bVar12 = (barrier_type)((ulong)in_R9 >> 0x20);
    }
    else if (kVar1 == bp_hyper_bar) {
      if (__kmp_barrier_gather_branch_bits[in_EDI] == 0) {
        __kmp_debug_assert((char *)CONCAT44(uVar10,in_stack_ffffffffffffff90),
                           (char *)&in_stack_ffffffffffffff88->value,iVar11);
      }
      __kmp_hyper_barrier_gather
                (bVar12,in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                 (_func_void_void_ptr_void_ptr *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),thr);
      bVar12 = (barrier_type)((ulong)in_R9 >> 0x20);
    }
    else if (kVar1 == bp_hierarchical_bar) {
      __kmp_hierarchical_barrier_gather
                (loc._4_4_,(kmp_info_t *)cur_time,other_threads._4_4_,(int)other_threads,_i,
                 (void *)delta);
      bVar12 = (barrier_type)((ulong)in_R9 >> 0x20);
    }
    else {
      __kmp_linear_barrier_gather
                (bt_00,(kmp_info_t *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                 (_func_void_void_ptr_void_ptr *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),(void *)0x16f0d4);
      bVar12 = (barrier_type)((ulong)in_R9 >> 0x20);
    }
    if (iVar3 == 0) {
      iVar11 = 0;
      if (__kmp_tasking_mode != tskm_immediate_exec) {
        __kmp_task_team_wait
                  ((kmp_info_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18,
                   (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar6);
      }
      if (__kmp_omp_cancellation != 0) {
        paVar5 = &(team_00->t).t_cancel_request;
        std::operator&(memory_order_relaxed,__memory_order_mask);
        in_stack_ffffffffffffff64 = (paVar5->super___atomic_base<int>)._M_i;
        if ((in_stack_ffffffffffffff64 == 2) || (in_stack_ffffffffffffff64 == 3)) {
          paVar4 = &(team_00->t).t_cancel_request;
          in_stack_fffffffffffffff4 = 0;
          in_stack_fffffffffffffff0 = 0;
          paVar5 = paVar4;
          in_stack_ffffffffffffffec = std::operator&(memory_order_relaxed,__memory_order_mask);
          iVar9 = (int)((ulong)paVar5 >> 0x20);
          if (in_stack_fffffffffffffff0 == 3) {
            (paVar4->super___atomic_base<int>)._M_i = in_stack_fffffffffffffff4;
          }
          else if (in_stack_fffffffffffffff0 == 5) {
            LOCK();
            (paVar4->super___atomic_base<int>)._M_i = in_stack_fffffffffffffff4;
            UNLOCK();
          }
          else {
            (paVar4->super___atomic_base<int>)._M_i = in_stack_fffffffffffffff4;
          }
        }
      }
      if (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0) {
        __kmp_itt_barrier_middle
                  (in_stack_fffffffffffffef4,
                   (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      if ((((__kmp_itt_frame_submit_v3_ptr__3_0 != (__kmp_itt_frame_submit_v3_t *)0x0) &&
           (__kmp_forkjoin_frames_mode != 0)) && ((thr->th).th_teams_microtask == (microtask_t)0x0))
         && ((team_00->t).t_active_level == 1)) {
        imbalance = (__kmp_threads[in_ESI]->th).th_ident;
        if (__kmp_itt_get_timestamp_ptr__3_0 == (__kmp_itt_get_timestamp_t *)0x0) {
          reduction = 0;
        }
        else {
          reduction = (*__kmp_itt_get_timestamp_ptr__3_0)();
        }
        in_stack_fffffffffffffefc = __kmp_forkjoin_frames_mode;
        ppkVar2 = (team_00->t).t_threads;
        iVar6 = (thr->th).th_team_nproc;
        if (__kmp_forkjoin_frames_mode == 1) {
          in_stack_fffffffffffffee8 = 0;
          kVar8 = reduction;
          __kmp_itt_frame_submit
                    (in_stack_00000014,CONCAT44(in_stack_0000000c,in_stack_00000008),
                     (__itt_timestamp)unaff_retaddr,iVar9,
                     (ident_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffec,in_stack_00000020);
          (thr->th).th_frame_time = kVar8;
        }
        else if (__kmp_forkjoin_frames_mode == 2) {
          in_stack_fffffffffffffee8 = 0;
          __kmp_itt_frame_submit
                    (in_stack_00000014,CONCAT44(in_stack_0000000c,in_stack_00000008),
                     (__itt_timestamp)unaff_retaddr,iVar9,
                     (ident_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffec,in_stack_00000020);
        }
        else if (__kmp_forkjoin_frames_mode == 3) {
          kVar8 = reduction;
          if (__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) {
            (thr->th).th_bar_arrive_time = 0;
            for (iVar7 = 1; iVar7 < iVar6; iVar7 = iVar7 + 1) {
              (ppkVar2[iVar7]->th).th_bar_arrive_time = 0;
            }
            __kmp_itt_metadata_imbalance
                      (in_stack_ffffffffffffff74,(kmp_uint64)begin,
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (kmp_uint64)imbalance,reduction);
          }
          in_stack_fffffffffffffee8 = 0;
          __kmp_itt_frame_submit
                    (in_stack_00000014,CONCAT44(in_stack_0000000c,in_stack_00000008),
                     (__itt_timestamp)unaff_retaddr,iVar9,
                     (ident_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffec,in_stack_00000020);
          (thr->th).th_frame_time = kVar8;
        }
        bt_00 = (barrier_type)(reduction >> 0x20);
      }
    }
    else {
      iVar11 = 1;
      if (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0) {
        __kmp_itt_barrier_middle
                  (in_stack_fffffffffffffef4,
                   (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
    }
    if ((iVar11 == 1) || (in_EDX == 0)) {
      kVar1 = __kmp_barrier_release_pattern[in_EDI];
      iVar9 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      if (kVar1 == bp_tree_bar) {
        if (__kmp_barrier_release_branch_bits[in_EDI] == 0) {
          __kmp_debug_assert((char *)CONCAT44(iVar11,in_stack_ffffffffffffff90),
                             (char *)&in_stack_ffffffffffffff88->value,iVar9);
        }
        __kmp_tree_barrier_release
                  ((barrier_type)((ulong)thr >> 0x20),(kmp_info_t *)team_00,iVar11,
                   in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   in_stack_ffffffffffffff80);
      }
      else if (kVar1 == bp_hyper_bar) {
        if (__kmp_barrier_release_branch_bits[in_EDI] == 0) {
          __kmp_debug_assert((char *)CONCAT44(iVar11,in_stack_ffffffffffffff90),
                             (char *)&in_stack_ffffffffffffff88->value,iVar9);
        }
        __kmp_hyper_barrier_release
                  (bVar12,(kmp_info_t *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                   (int)((ulong)thr >> 0x20),(int)thr,(int)((ulong)team_00 >> 0x20),
                   (void *)CONCAT44(iVar11,in_stack_ffffffffffffff90));
      }
      else if (kVar1 == bp_hierarchical_bar) {
        __kmp_hierarchical_barrier_release
                  (in_stack_00000024,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                   in_stack_0000000c,unaff_retaddr);
      }
      else {
        __kmp_linear_barrier_release
                  (bt_00,(kmp_info_t *)CONCAT44(in_stack_fffffffffffffefc,kVar1),
                   in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                   (void *)0x16f6da);
      }
      if (__kmp_tasking_mode != tskm_immediate_exec) {
        __kmp_task_team_sync(thr,team_00);
      }
    }
    if (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0) {
      __kmp_itt_barrier_finished
                (in_stack_fffffffffffffef4,
                 (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
  }
  else {
    iVar11 = 0;
    if ((__kmp_tasking_mode != tskm_immediate_exec) &&
       ((thr->th).th_task_team != (kmp_task_team_t *)0x0)) {
      if (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0) {
        __kmp_itt_barrier_object
                  (in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,iVar6,
                   (int)in_stack_ffffffffffffff38);
        __kmp_itt_barrier_starting
                  (in_stack_fffffffffffffef4,
                   (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      __kmp_task_team_wait
                ((kmp_info_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18,
                 (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      __kmp_task_team_setup
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0) {
        __kmp_itt_barrier_finished
                  (in_stack_fffffffffffffef4,
                   (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
    }
  }
  if (((ulong)ompt_enabled & 1) != 0) {
    if (((ulong)ompt_enabled >> 0x10 & 1) != 0) {
      (*ompt_callbacks.ompt_callback_sync_region_wait_callback)
                (in_stack_ffffffffffffff74,ompt_scope_end,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff88,local_88);
    }
    if (((ulong)ompt_enabled >> 0x17 & 1) != 0) {
      (*ompt_callbacks.ompt_callback_sync_region_callback)
                (in_stack_ffffffffffffff74,ompt_scope_end,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff88,local_88);
    }
    *(char *)((long)thr + 0x160) = '\x01';
    *(char *)((long)thr + 0x161) = '\0';
    *(char *)((long)thr + 0x162) = '\0';
    *(char *)((long)thr + 0x163) = '\0';
  }
  return iVar11;
}

Assistant:

static int __kmp_barrier_template(enum barrier_type bt, int gtid, int is_split,
                                  size_t reduce_size, void *reduce_data,
                                  void (*reduce)(void *, void *)) {
  KMP_TIME_PARTITIONED_BLOCK(OMP_plain_barrier);
  KMP_SET_THREAD_STATE_BLOCK(PLAIN_BARRIER);
  int tid = __kmp_tid_from_gtid(gtid);
  kmp_info_t *this_thr = __kmp_threads[gtid];
  kmp_team_t *team = this_thr->th.th_team;
  int status = 0;
  is_cancellable<cancellable> cancelled;
#if OMPT_SUPPORT && OMPT_OPTIONAL
  ompt_data_t *my_task_data;
  ompt_data_t *my_parallel_data;
  void *return_address;
  ompt_sync_region_t barrier_kind;
#endif

  KA_TRACE(15, ("__kmp_barrier: T#%d(%d:%d) has arrived\n", gtid,
                __kmp_team_from_gtid(gtid)->t.t_id, __kmp_tid_from_gtid(gtid)));

  ANNOTATE_BARRIER_BEGIN(&team->t.t_bar);
#if OMPT_SUPPORT
  if (ompt_enabled.enabled) {
#if OMPT_OPTIONAL
    my_task_data = OMPT_CUR_TASK_DATA(this_thr);
    my_parallel_data = OMPT_CUR_TEAM_DATA(this_thr);
    return_address = this_thr->th.ompt_thread_info.return_address; 
    barrier_kind = __ompt_get_barrier_kind(bt, this_thr);
    if (ompt_enabled.ompt_callback_sync_region) {
      ompt_callbacks.ompt_callback(ompt_callback_sync_region)(
          barrier_kind, ompt_scope_begin, my_parallel_data, my_task_data,
          return_address);
    }
    if (ompt_enabled.ompt_callback_sync_region_wait) {
      ompt_callbacks.ompt_callback(ompt_callback_sync_region_wait)(
          barrier_kind, ompt_scope_begin, my_parallel_data, my_task_data,
          return_address);
    }
#endif
    // It is OK to report the barrier state after the barrier begin callback.
    // According to the OMPT specification, a compliant implementation may
    // even delay reporting this state until the barrier begins to wait.
    this_thr->th.ompt_thread_info.state = ompt_state_wait_barrier;
  }
#endif

  if (!team->t.t_serialized) {
#if USE_ITT_BUILD
    // This value will be used in itt notify events below.
    void *itt_sync_obj = NULL;
#if USE_ITT_NOTIFY
    if (__itt_sync_create_ptr || KMP_ITT_DEBUG)
      itt_sync_obj = __kmp_itt_barrier_object(gtid, bt, 1);
#endif
#endif /* USE_ITT_BUILD */
    if (__kmp_tasking_mode == tskm_extra_barrier) {
      __kmp_tasking_barrier(team, this_thr, gtid);
      KA_TRACE(15,
               ("__kmp_barrier: T#%d(%d:%d) past tasking barrier\n", gtid,
                __kmp_team_from_gtid(gtid)->t.t_id, __kmp_tid_from_gtid(gtid)));
    }

    /* Copy the blocktime info to the thread, where __kmp_wait_template() can
       access it when the team struct is not guaranteed to exist. */
    // See note about the corresponding code in __kmp_join_barrier() being
    // performance-critical.
    if (__kmp_dflt_blocktime != KMP_MAX_BLOCKTIME) {
#if KMP_USE_MONITOR
      this_thr->th.th_team_bt_intervals =
          team->t.t_implicit_task_taskdata[tid].td_icvs.bt_intervals;
      this_thr->th.th_team_bt_set =
          team->t.t_implicit_task_taskdata[tid].td_icvs.bt_set;
#else
      this_thr->th.th_team_bt_intervals = KMP_BLOCKTIME_INTERVAL(team, tid);
#endif
    }

#if USE_ITT_BUILD
    if (__itt_sync_create_ptr || KMP_ITT_DEBUG)
      __kmp_itt_barrier_starting(gtid, itt_sync_obj);
#endif /* USE_ITT_BUILD */
#if USE_DEBUGGER
    // Let the debugger know: the thread arrived to the barrier and waiting.
    if (KMP_MASTER_TID(tid)) { // Master counter is stored in team structure.
      team->t.t_bar[bt].b_master_arrived += 1;
    } else {
      this_thr->th.th_bar[bt].bb.b_worker_arrived += 1;
    } // if
#endif /* USE_DEBUGGER */
    if (reduce != NULL) {
      // KMP_DEBUG_ASSERT( is_split == TRUE );  // #C69956
      this_thr->th.th_local.reduce_data = reduce_data;
    }

    if (KMP_MASTER_TID(tid) && __kmp_tasking_mode != tskm_immediate_exec)
      // use 0 to only setup the current team if nthreads > 1
      __kmp_task_team_setup(this_thr, team, 0);

    if (cancellable) {
      cancelled = __kmp_linear_barrier_gather_cancellable(
          bt, this_thr, gtid, tid, reduce USE_ITT_BUILD_ARG(itt_sync_obj));
    } else {
      switch (__kmp_barrier_gather_pattern[bt]) {
      case bp_hyper_bar: {
        // don't set branch bits to 0; use linear
        KMP_ASSERT(__kmp_barrier_gather_branch_bits[bt]);
        __kmp_hyper_barrier_gather(bt, this_thr, gtid, tid,
                                   reduce USE_ITT_BUILD_ARG(itt_sync_obj));
        break;
      }
      case bp_hierarchical_bar: {
        __kmp_hierarchical_barrier_gather(
            bt, this_thr, gtid, tid, reduce USE_ITT_BUILD_ARG(itt_sync_obj));
        break;
      }
      case bp_tree_bar: {
        // don't set branch bits to 0; use linear
        KMP_ASSERT(__kmp_barrier_gather_branch_bits[bt]);
        __kmp_tree_barrier_gather(bt, this_thr, gtid, tid,
                                  reduce USE_ITT_BUILD_ARG(itt_sync_obj));
        break;
      }
      default: {
        __kmp_linear_barrier_gather(bt, this_thr, gtid, tid,
                                    reduce USE_ITT_BUILD_ARG(itt_sync_obj));
      }
      }
    }

    KMP_MB();

    if (KMP_MASTER_TID(tid)) {
      status = 0;
      if (__kmp_tasking_mode != tskm_immediate_exec && !cancelled) {
        __kmp_task_team_wait(this_thr, team USE_ITT_BUILD_ARG(itt_sync_obj));
      }
#if USE_DEBUGGER
      // Let the debugger know: All threads are arrived and starting leaving the
      // barrier.
      team->t.t_bar[bt].b_team_arrived += 1;
#endif

      if (__kmp_omp_cancellation) {
        kmp_int32 cancel_request = KMP_ATOMIC_LD_RLX(&team->t.t_cancel_request);
        // Reset cancellation flag for worksharing constructs
        if (cancel_request == cancel_loop ||
            cancel_request == cancel_sections) {
          KMP_ATOMIC_ST_RLX(&team->t.t_cancel_request, cancel_noreq);
        }
      }
#if USE_ITT_BUILD
      /* TODO: In case of split reduction barrier, master thread may send
         acquired event early, before the final summation into the shared
         variable is done (final summation can be a long operation for array
         reductions).  */
      if (__itt_sync_create_ptr || KMP_ITT_DEBUG)
        __kmp_itt_barrier_middle(gtid, itt_sync_obj);
#endif /* USE_ITT_BUILD */
#if USE_ITT_BUILD && USE_ITT_NOTIFY
      // Barrier - report frame end (only if active_level == 1)
      if ((__itt_frame_submit_v3_ptr || KMP_ITT_DEBUG) &&
          __kmp_forkjoin_frames_mode &&
          this_thr->th.th_teams_microtask == NULL &&
          team->t.t_active_level == 1) {
        ident_t *loc = __kmp_threads[gtid]->th.th_ident;
        kmp_uint64 cur_time = __itt_get_timestamp();
        kmp_info_t **other_threads = team->t.t_threads;
        int nproc = this_thr->th.th_team_nproc;
        int i;
        switch (__kmp_forkjoin_frames_mode) {
        case 1:
          __kmp_itt_frame_submit(gtid, this_thr->th.th_frame_time, cur_time, 0,
                                 loc, nproc);
          this_thr->th.th_frame_time = cur_time;
          break;
        case 2: // AC 2015-01-19: currently does not work for hierarchical (to
          // be fixed)
          __kmp_itt_frame_submit(gtid, this_thr->th.th_bar_min_time, cur_time,
                                 1, loc, nproc);
          break;
        case 3:
          if (__itt_metadata_add_ptr) {
            // Initialize with master's wait time
            kmp_uint64 delta = cur_time - this_thr->th.th_bar_arrive_time;
            // Set arrive time to zero to be able to check it in
            // __kmp_invoke_task(); the same is done inside the loop below
            this_thr->th.th_bar_arrive_time = 0;
            for (i = 1; i < nproc; ++i) {
              delta += (cur_time - other_threads[i]->th.th_bar_arrive_time);
              other_threads[i]->th.th_bar_arrive_time = 0;
            }
            __kmp_itt_metadata_imbalance(gtid, this_thr->th.th_frame_time,
                                         cur_time, delta,
                                         (kmp_uint64)(reduce != NULL));
          }
          __kmp_itt_frame_submit(gtid, this_thr->th.th_frame_time, cur_time, 0,
                                 loc, nproc);
          this_thr->th.th_frame_time = cur_time;
          break;
        }
      }
#endif /* USE_ITT_BUILD */
    } else {
      status = 1;
#if USE_ITT_BUILD
      if (__itt_sync_create_ptr || KMP_ITT_DEBUG)
        __kmp_itt_barrier_middle(gtid, itt_sync_obj);
#endif /* USE_ITT_BUILD */
    }
    if ((status == 1 || !is_split) && !cancelled) {
      if (cancellable) {
        cancelled = __kmp_linear_barrier_release_cancellable(
            bt, this_thr, gtid, tid, FALSE USE_ITT_BUILD_ARG(itt_sync_obj));
      } else {
        switch (__kmp_barrier_release_pattern[bt]) {
        case bp_hyper_bar: {
          KMP_ASSERT(__kmp_barrier_release_branch_bits[bt]);
          __kmp_hyper_barrier_release(bt, this_thr, gtid, tid,
                                      FALSE USE_ITT_BUILD_ARG(itt_sync_obj));
          break;
        }
        case bp_hierarchical_bar: {
          __kmp_hierarchical_barrier_release(
              bt, this_thr, gtid, tid, FALSE USE_ITT_BUILD_ARG(itt_sync_obj));
          break;
        }
        case bp_tree_bar: {
          KMP_ASSERT(__kmp_barrier_release_branch_bits[bt]);
          __kmp_tree_barrier_release(bt, this_thr, gtid, tid,
                                     FALSE USE_ITT_BUILD_ARG(itt_sync_obj));
          break;
        }
        default: {
          __kmp_linear_barrier_release(bt, this_thr, gtid, tid,
                                       FALSE USE_ITT_BUILD_ARG(itt_sync_obj));
        }
        }
      }
      if (__kmp_tasking_mode != tskm_immediate_exec && !cancelled) {
        __kmp_task_team_sync(this_thr, team);
      }
    }

#if USE_ITT_BUILD
    /* GEH: TODO: Move this under if-condition above and also include in
       __kmp_end_split_barrier(). This will more accurately represent the actual
       release time of the threads for split barriers.  */
    if (__itt_sync_create_ptr || KMP_ITT_DEBUG)
      __kmp_itt_barrier_finished(gtid, itt_sync_obj);
#endif /* USE_ITT_BUILD */
  } else { // Team is serialized.
    status = 0;
    if (__kmp_tasking_mode != tskm_immediate_exec) {
      if (this_thr->th.th_task_team != NULL) {
#if USE_ITT_NOTIFY
        void *itt_sync_obj = NULL;
        if (__itt_sync_create_ptr || KMP_ITT_DEBUG) {
          itt_sync_obj = __kmp_itt_barrier_object(gtid, bt, 1);
          __kmp_itt_barrier_starting(gtid, itt_sync_obj);
        }
#endif

        KMP_DEBUG_ASSERT(this_thr->th.th_task_team->tt.tt_found_proxy_tasks ==
                         TRUE);
        __kmp_task_team_wait(this_thr, team USE_ITT_BUILD_ARG(itt_sync_obj));
        __kmp_task_team_setup(this_thr, team, 0);

#if USE_ITT_BUILD
        if (__itt_sync_create_ptr || KMP_ITT_DEBUG)
          __kmp_itt_barrier_finished(gtid, itt_sync_obj);
#endif /* USE_ITT_BUILD */
      }
    }
  }
  KA_TRACE(15, ("__kmp_barrier: T#%d(%d:%d) is leaving with return value %d\n",
                gtid, __kmp_team_from_gtid(gtid)->t.t_id,
                __kmp_tid_from_gtid(gtid), status));

#if OMPT_SUPPORT
  if (ompt_enabled.enabled) {
#if OMPT_OPTIONAL
    if (ompt_enabled.ompt_callback_sync_region_wait) {
      ompt_callbacks.ompt_callback(ompt_callback_sync_region_wait)(
          barrier_kind, ompt_scope_end, my_parallel_data, my_task_data,
          return_address);
    }
    if (ompt_enabled.ompt_callback_sync_region) {
      ompt_callbacks.ompt_callback(ompt_callback_sync_region)(
          barrier_kind, ompt_scope_end, my_parallel_data, my_task_data,
          return_address);
    }
#endif
    this_thr->th.ompt_thread_info.state = ompt_state_work_parallel;
  }
#endif
  ANNOTATE_BARRIER_END(&team->t.t_bar);

  if (cancellable)
    return (int)cancelled;
  return status;
}